

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryEmitGeometryShaderTests.cpp
# Opt level: O1

string * __thiscall
vkt::geometry::(anonymous_namespace)::EmitTest::shaderGeometry_abi_cxx11_
          (string *__return_storage_ptr__,void *this,bool pointSize)

{
  ostream *poVar1;
  VkPrimitiveTopology *outputType;
  int iVar2;
  ostringstream src;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#version 310 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"#extension GL_EXT_geometry_shader : require\n",0x2c);
  if (pointSize) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"#extension GL_EXT_geometry_point_size : require\n",0x30);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(points) in;\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"layout(",7);
  outputTypeToGLString_abi_cxx11_(&local_1c8,(geometry *)((long)this + 0x70),outputType);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", max_vertices = ",0x11);
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,*(int *)((long)this + 0x74) + *(int *)((long)this + 0x7c) + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") out;\n",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"layout(location = 0) in highp vec4 v_geom_FragColor[];\n",0x37);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"layout(location = 0) out highp vec4 v_frag_FragColor;\n",0x36);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"void main (void)\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\tconst highp vec4 position0 = vec4(-0.5,  0.5, 0.0, 0.0);\n",0x3a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\tconst highp vec4 position1 = vec4( 0.0,  0.1, 0.0, 0.0);\n",0x3a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\tconst highp vec4 position2 = vec4( 0.5,  0.5, 0.0, 0.0);\n",0x3a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\tconst highp vec4 position3 = vec4( 0.7, -0.2, 0.0, 0.0);\n",0x3a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\tconst highp vec4 position4 = vec4( 0.2,  0.2, 0.0, 0.0);\n",0x3a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\tconst highp vec4 position5 = vec4( 0.4, -0.3, 0.0, 0.0);\n",0x3a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (0 < *(int *)((long)this + 0x74)) {
    iVar2 = 0;
    do {
      if (pointSize) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"\tgl_PointSize = 1.0;\n",0x15);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"\tgl_Position = gl_in[0].gl_Position + position",0x2e);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,
                 ";\n\tgl_PrimitiveID = gl_PrimitiveIDIn;\n\tv_frag_FragColor = v_geom_FragColor[0];\n\tEmitVertex();\n\n"
                 ,0x5f);
      iVar2 = iVar2 + 1;
    } while (iVar2 < *(int *)((long)this + 0x74));
  }
  if (0 < *(int *)((long)this + 0x78)) {
    iVar2 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"\tEndPrimitive();\n",0x11);
      iVar2 = iVar2 + 1;
    } while (iVar2 < *(int *)((long)this + 0x78));
  }
  if (0 < *(int *)((long)this + 0x7c)) {
    iVar2 = 0;
    do {
      if (pointSize) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"\tgl_PointSize = 1.0;\n",0x15);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"\tgl_Position = gl_in[0].gl_Position + position",0x2e);
      poVar1 = (ostream *)
               std::ostream::operator<<((ostream *)local_1a8,*(int *)((long)this + 0x74) + iVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,
                 ";\n\tgl_PrimitiveID = gl_PrimitiveIDIn;\n\tv_frag_FragColor = v_geom_FragColor[0];\n\tEmitVertex();\n\n"
                 ,0x5f);
      iVar2 = iVar2 + 1;
    } while (iVar2 < *(int *)((long)this + 0x7c));
  }
  if (0 < *(int *)((long)this + 0x80)) {
    iVar2 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"\tEndPrimitive();\n",0x11);
      iVar2 = iVar2 + 1;
    } while (iVar2 < *(int *)((long)this + 0x80));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string EmitTest::shaderGeometry (bool pointSize) const
{
	std::ostringstream src;
	src	<< "#version 310 es\n"
		<< "#extension GL_EXT_geometry_shader : require\n";
	if (pointSize)
		src	<<"#extension GL_EXT_geometry_point_size : require\n";
	src	<< "layout(points) in;\n"
		<< "layout(" << outputTypeToGLString(m_emitTestSpec.primitiveTopology) << ", max_vertices = " << (m_emitTestSpec.emitCountA + m_emitTestSpec.emitCountB +1) << ") out;\n"
		<< "layout(location = 0) in highp vec4 v_geom_FragColor[];\n"
		<< "layout(location = 0) out highp vec4 v_frag_FragColor;\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	const highp vec4 position0 = vec4(-0.5,  0.5, 0.0, 0.0);\n"
		<< "	const highp vec4 position1 = vec4( 0.0,  0.1, 0.0, 0.0);\n"
		<< "	const highp vec4 position2 = vec4( 0.5,  0.5, 0.0, 0.0);\n"
		<< "	const highp vec4 position3 = vec4( 0.7, -0.2, 0.0, 0.0);\n"
		<< "	const highp vec4 position4 = vec4( 0.2,  0.2, 0.0, 0.0);\n"
		<< "	const highp vec4 position5 = vec4( 0.4, -0.3, 0.0, 0.0);\n";
	for (int i = 0; i < m_emitTestSpec.emitCountA; ++i)
	{
		if (pointSize)
			src	<< "	gl_PointSize = 1.0;\n";
		src <<	"	gl_Position = gl_in[0].gl_Position + position" << i << ";\n"
				"	gl_PrimitiveID = gl_PrimitiveIDIn;\n"
				"	v_frag_FragColor = v_geom_FragColor[0];\n"
				"	EmitVertex();\n"
				"\n";
	}

	for (int i = 0; i < m_emitTestSpec.endCountA; ++i)
		src << "	EndPrimitive();\n";

	for (int i = 0; i < m_emitTestSpec.emitCountB; ++i)
	{
		if (pointSize)
			src	<< "	gl_PointSize = 1.0;\n";
		src <<	"	gl_Position = gl_in[0].gl_Position + position" << (m_emitTestSpec.emitCountA + i) << ";\n"
				"	gl_PrimitiveID = gl_PrimitiveIDIn;\n"
				"	v_frag_FragColor = v_geom_FragColor[0];\n"
				"	EmitVertex();\n"
				"\n";
	}

	for (int i = 0; i < m_emitTestSpec.endCountB; ++i)
		src << "	EndPrimitive();\n";
	src	<< "}\n";
	return src.str();
}